

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeNumberPrototype
               (DynamicObject *numberPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  ScriptContext *this;
  JavascriptLibrary *this_00;
  RuntimeFunction **ppRVar1;
  JavascriptMethod p_Var2;
  JavascriptFunction *pJVar3;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *numberPrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,numberPrototype,mode,8,0);
  this = RecyclableObject::GetScriptContext(&numberPrototype->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&numberPrototype->super_RecyclableObject);
  ppRVar1 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&(this_00->super_JavascriptLibraryBase).numberConstructor)
  ;
  AddMember(this_00,numberPrototype,0x67,*ppRVar1);
  p_Var2 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptNumber::EntryInfo::ToExponential);
  pJVar3 = AddFunctionToLibraryObject
                     (this_00,numberPrototype,0x16c,
                      (FunctionInfo *)JavascriptNumber::EntryInfo::ToExponential,1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var2,pJVar3);
  p_Var2 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptNumber::EntryInfo::ToFixed)
  ;
  pJVar3 = AddFunctionToLibraryObject
                     (this_00,numberPrototype,0x16d,
                      (FunctionInfo *)JavascriptNumber::EntryInfo::ToFixed,1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var2,pJVar3);
  p_Var2 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptNumber::EntryInfo::ToPrecision);
  pJVar3 = AddFunctionToLibraryObject
                     (this_00,numberPrototype,0x176,
                      (FunctionInfo *)JavascriptNumber::EntryInfo::ToPrecision,1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var2,pJVar3);
  p_Var2 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptNumber::EntryInfo::ToLocaleString);
  pJVar3 = AddFunctionToLibraryObject
                     (this_00,numberPrototype,0x172,
                      (FunctionInfo *)JavascriptNumber::EntryInfo::ToLocaleString,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var2,pJVar3);
  p_Var2 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptNumber::EntryInfo::ToString);
  pJVar3 = AddFunctionToLibraryObject
                     (this_00,numberPrototype,0x178,
                      (FunctionInfo *)JavascriptNumber::EntryInfo::ToString,1,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var2,pJVar3);
  p_Var2 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptNumber::EntryInfo::ValueOf)
  ;
  pJVar3 = AddFunctionToLibraryObject
                     (this_00,numberPrototype,0x18e,
                      (FunctionInfo *)JavascriptNumber::EntryInfo::ValueOf,0,'\x06');
  ScriptContext::SetBuiltInLibraryFunction(this,p_Var2,pJVar3);
  DynamicObject::SetHasNoEnumerableProperties(numberPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeNumberPrototype(DynamicObject* numberPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(numberPrototype, mode, 8);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterNumber
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = numberPrototype->GetScriptContext();
        JavascriptLibrary* library = numberPrototype->GetLibrary();
        library->AddMember(numberPrototype, PropertyIds::constructor, library->numberConstructor);
        scriptContext->SetBuiltInLibraryFunction(JavascriptNumber::EntryInfo::ToExponential.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(numberPrototype, PropertyIds::toExponential, &JavascriptNumber::EntryInfo::ToExponential, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptNumber::EntryInfo::ToFixed.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(numberPrototype, PropertyIds::toFixed, &JavascriptNumber::EntryInfo::ToFixed, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptNumber::EntryInfo::ToPrecision.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(numberPrototype, PropertyIds::toPrecision, &JavascriptNumber::EntryInfo::ToPrecision, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptNumber::EntryInfo::ToLocaleString.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(numberPrototype, PropertyIds::toLocaleString, &JavascriptNumber::EntryInfo::ToLocaleString, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptNumber::EntryInfo::ToString.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(numberPrototype, PropertyIds::toString, &JavascriptNumber::EntryInfo::ToString, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptNumber::EntryInfo::ValueOf.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(numberPrototype, PropertyIds::valueOf, &JavascriptNumber::EntryInfo::ValueOf, 0));

        numberPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }